

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O0

SectionNode * __thiscall
asmjit::v1_14::ZoneAllocator::
newT<asmjit::v1_14::SectionNode,asmjit::v1_14::BaseBuilder*,unsigned_int&>
          (ZoneAllocator *this,BaseBuilder **args,uint *args_1)

{
  undefined4 uVar1;
  long lVar2;
  SectionNode *pSVar3;
  undefined4 *in_RDX;
  long *in_RSI;
  void *p;
  size_t in_stack_ffffffffffffff58;
  ZoneAllocator *in_stack_ffffffffffffff60;
  SectionNode *local_90;
  SectionNode *local_50;
  
  pSVar3 = allocT<asmjit::v1_14::SectionNode>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (pSVar3 == (SectionNode *)0x0) {
    local_50 = (SectionNode *)0x0;
  }
  else {
    local_90 = (SectionNode *)0x0;
    if (pSVar3 != (SectionNode *)0x0) {
      lVar2 = *in_RSI;
      uVar1 = *in_RDX;
      *(undefined8 *)pSVar3 = 0;
      *(undefined8 *)(pSVar3 + 8) = 0;
      pSVar3[0x10] = (SectionNode)0x2;
      pSVar3[0x11] = (SectionNode)(*(byte *)(lVar2 + 0x1b0) | 0x10);
      pSVar3[0x12] = (SectionNode)0x0;
      pSVar3[0x13] = (SectionNode)0x0;
      *(undefined4 *)(pSVar3 + 0x14) = 0;
      *(undefined8 *)(pSVar3 + 0x18) = 0;
      *(undefined8 *)(pSVar3 + 0x20) = 0;
      *(undefined8 *)(pSVar3 + 0x28) = 0;
      *(undefined4 *)(pSVar3 + 0x30) = uVar1;
      *(undefined8 *)(pSVar3 + 0x38) = 0;
      local_90 = pSVar3;
    }
    local_50 = local_90;
  }
  return local_50;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }